

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v5.cpp
# Opt level: O2

error_handler_result __thiscall
stmt_tag::
on_error<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,boost::spirit::x3::context<error_counter_tag,std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,boost::spirit::x3::context<boost::spirit::x3::skipper_tag,boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,boost::spirit::x3::space_tag>const,boost::spirit::x3::unused_type>>>
          (stmt_tag *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *last,
          expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *x,context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
             *context)

{
  error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *peVar1;
  error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>_>
  er;
  
  error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>_>
  ::operator()(&er,first,last,x,context);
  peVar1 = context->val->_M_data;
  peVar1->error_count = peVar1->error_count + 1;
  first->_M_current = (x->where_)._M_current;
  return accept;
}

Assistant:

x3::error_handler_result on_error(
      Iterator& first, Iterator const& last, Exception const& x,
      Context const& context)
   {
      error_reporter<Iterator, Exception, Context> er;

      er(first, last, x ,context);

      auto& counter = x3::get<error_counter_tag>(context).get();

      counter(first, last);

      first = x.where();
      return x3::error_handler_result::accept;
    }